

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O2

void __thiscall
Memory::RecyclerSweep::
MergePendingNewMediumHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list;
  
  list = (this->mediumWithBarrierData).pendingMergeNewHeapBlockList;
  (this->mediumWithBarrierData).pendingMergeNewHeapBlockList =
       (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewMediumHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewMediumHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetMediumBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}